

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O1

string * HeadingText_abi_cxx11_(string *__return_storage_ptr__,double h)

{
  long lVar1;
  double dVar2;
  double dVar3;
  allocator<char> local_39;
  double local_38;
  double local_30;
  double local_28;
  
  if (h < 0.0) {
    do {
      h = h + 360.0;
    } while (h < 0.0);
  }
  for (; 360.0 <= h; h = h + -360.0) {
  }
  dVar2 = 0.0;
  lVar1 = 0;
  local_38 = h;
  while( true ) {
    dVar3 = dVar2 + 11.25;
    if (h <= dVar3) {
      local_30 = dVar3;
      local_28 = dVar2;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,*(char **)(&DAT_002ddba0 + lVar1),&local_39);
      h = local_38;
      dVar2 = local_28;
      dVar3 = local_30;
    }
    else {
      dVar2 = dVar2 + 22.5;
    }
    if (h <= dVar3) break;
    lVar1 = lVar1 + 8;
    if (lVar1 == 0x80) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"N","");
      return __return_storage_ptr__;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HeadingText (double h)
{
    constexpr double CARDINAL_HALF_SEGMENT = 360.0 / 16.0 / 2.0;
    h = HeadingNormalize(h);
    double card = 0.0;
    for (const char* sCard: { "N", "NNE", "NE", "ENE",
                              "E", "ESE", "SE", "SSE",
                              "S", "SSW", "SW", "WSW",
                              "W", "WNW", "NW", "NNW" })
    {
        if (h <= card + CARDINAL_HALF_SEGMENT)
            return sCard;
        card += CARDINAL_HALF_SEGMENT * 2.0;
    }
    return "N";
}